

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidgetPrivate::setWinId(QWidgetPrivate *this,WId id)

{
  WId WVar1;
  long in_FS_OFFSET;
  unsigned_long_long copy;
  QWidget *q;
  undefined1 *local_48;
  undefined1 *puStack_40;
  QWidget *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = *(QWidget **)&this->field_0x8;
  if ((mapper != (QWidgetMapper *)0x0) && ((this->data).winid != 0)) {
    QHash<unsigned_long_long,_QWidget_*>::removeImpl<unsigned_long_long>(mapper,&(this->data).winid)
    ;
  }
  WVar1 = (this->data).winid;
  (this->data).winid = id;
  if (id != 0 && mapper != (QWidgetMapper *)0x0) {
    local_48 = (undefined1 *)id;
    QHash<unsigned_long_long,QWidget*>::emplace<QWidget*const&>
              ((QHash<unsigned_long_long,QWidget*> *)mapper,(unsigned_long_long *)&local_48,
               &local_30);
  }
  if (WVar1 != id) {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_48,WinIdChange);
    QCoreApplication::sendEvent(&local_30->super_QObject,(QEvent *)&local_48);
    QEvent::~QEvent((QEvent *)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::setWinId(WId id)                // set widget identifier
{
    Q_Q(QWidget);
    if (mapper && data.winid) {
        mapper->remove(data.winid);
    }

    const WId oldWinId = data.winid;

    data.winid = id;
    if (mapper && id) {
        mapper->insert(data.winid, q);
    }

    if (oldWinId != id) {
        QEvent e(QEvent::WinIdChange);
        QCoreApplication::sendEvent(q, &e);
    }
}